

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * cmake::FindCacheFile(string *__return_storage_ptr__,string *binaryDir)

{
  bool bVar1;
  char *in_R8;
  string cachePathFound;
  string cmakeFiles;
  string cacheFile;
  string local_90;
  char *local_70 [4];
  char *local_50 [4];
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)binaryDir);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_50,(string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)local_50);
  bVar1 = cmsys::SystemTools::FileExists(local_50[0]);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_70,(string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)local_70);
    bVar1 = cmsys::SystemTools::FileExists(local_70[0]);
    if (bVar1) {
      cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                (&local_90,(cmSystemTools *)0x5134f3,(__return_storage_ptr__->_M_dataplus)._M_p,"/",
                 in_R8);
      if (local_90._M_string_length != 0) {
        cmsys::SystemTools::GetFilenamePath(&local_30,&local_90);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::FindCacheFile(const std::string& binaryDir)
{
  std::string cachePath = binaryDir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cachePath;
  cacheFile += "/CMakeCache.txt";
  if (!cmSystemTools::FileExists(cacheFile.c_str())) {
    // search in parent directories for cache
    std::string cmakeFiles = cachePath;
    cmakeFiles += "/CMakeFiles";
    if (cmSystemTools::FileExists(cmakeFiles.c_str())) {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories("CMakeCache.txt",
                                                     cachePath.c_str(), "/");
      if (!cachePathFound.empty()) {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
      }
    }
  }
  return cachePath;
}